

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client-ws.c
# Opt level: O2

int lws_ws_handshake_client(lws *wsi,uchar **buf,size_t len)

{
  uint uVar1;
  uchar *puVar2;
  int iVar3;
  ulong uVar4;
  uchar *puVar5;
  
  puVar5 = *buf;
  uVar1 = wsi->wsistate;
  if (((((short)uVar1 == 0x12) || ((uVar1 & 0xffff) == 0x203)) || ((uVar1 & 0xffff) == 0x20b)) ||
     (iVar3 = 0, (uVar1 >> 0x1c & 1) != 0)) {
    _lws_log(0x10,"%s: hs client feels it has %d in\n","lws_ws_handshake_client",len & 0xffffffff);
    do {
      uVar4 = len;
      if (uVar4 == 0) {
        return 0;
      }
      if (wsi->rxflow_bitmap != '\0') {
        _lws_log(0x10,"%s: caching %ld\n","lws_ws_handshake_client",uVar4);
        iVar3 = lws_rxflow_cache(wsi,*buf,0,(int)uVar4);
        if (iVar3 == 2) {
          _lws_log(8,"%s: trimming inside rxflow cache\n","lws_ws_handshake_client");
        }
        else {
          puVar5 = *buf + uVar4;
        }
        *buf = puVar5;
        return 0;
      }
      puVar2 = *buf;
      *buf = puVar2 + 1;
      iVar3 = lws_ws_client_rx_sm(wsi,*puVar2);
      len = uVar4 - 1;
    } while (iVar3 == 0);
    _lws_log(4,"%s: client_rx_sm exited, DROPPING %d\n","lws_ws_handshake_client",uVar4 & 0xffffffff
            );
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int
lws_ws_handshake_client(struct lws *wsi, unsigned char **buf, size_t len)
{
	unsigned char *bufin = *buf;

	if ((lwsi_state(wsi) != LRS_WAITING_PROXY_REPLY) &&
	    (lwsi_state(wsi) != LRS_H1C_ISSUE_HANDSHAKE) &&
	    (lwsi_state(wsi) != LRS_WAITING_SERVER_REPLY) &&
	    !lwsi_role_client(wsi))
		return 0;

	lwsl_debug("%s: hs client feels it has %d in\n", __func__, (int)len);

	while (len) {
		/*
		 * we were accepting input but now we stopped doing so
		 */
		if (lws_is_flowcontrolled(wsi)) {
			lwsl_debug("%s: caching %ld\n", __func__, (long)len);
			/*
			 * Since we cached the remaining available input, we
			 * can say we "consumed" it.
			 *
			 * But what about the case where the available input
			 * came out of the rxflow cache already?  If we are
			 * effectively "putting it back in the cache", we have
			 * to place it at the cache head, not the tail as usual.
			 */
			if (lws_rxflow_cache(wsi, *buf, 0, (int)len) ==
							LWSRXFC_TRIMMED) {
				/*
				 * we dealt with it by trimming the existing
				 * rxflow cache HEAD to account for what we used.
				 *
				 * indicate we didn't use anything to the caller
				 * so he doesn't do any consumed processing
				 */
				lwsl_info("%s: trimming inside rxflow cache\n",
						__func__);
				*buf = bufin;
			} else
				*buf += len;

			return 0;
		}
#if !defined(LWS_WITHOUT_EXTENSIONS)
		if (wsi->ws->rx_draining_ext) {
			int m;

			lwsl_info("%s: draining ext\n", __func__);
			if (lwsi_role_client(wsi))
				m = lws_ws_client_rx_sm(wsi, 0);
			else
				m = lws_ws_rx_sm(wsi, 0, 0);
			if (m < 0)
				return -1;
			continue;
		}
#endif
		/*
		 * caller will account for buflist usage by studying what
		 * happened to *buf
		 */

		if (lws_ws_client_rx_sm(wsi, *(*buf)++)) {
			lwsl_notice("%s: client_rx_sm exited, DROPPING %d\n",
				    __func__, (int)len);
			return -1;
		}
		len--;
	}
	// lwsl_notice("%s: finished with %ld\n", __func__, (long)len);

	return 0;
}